

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

mraa_result_t mraa_gpio_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  uint uVar1;
  _func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *UNRECOVERED_JUMPTABLE;
  undefined4 uVar2;
  mraa_result_t mVar3;
  int __fd;
  mraa_gpio_events_t pmVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  size_t __size;
  size_t sStack_c0;
  char bu [64];
  char filepath [64];
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    mVar3 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_edge_mode_replace,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *)0x0)) {
      mVar3 = (*UNRECOVERED_JUMPTABLE)(dev,mode);
      return mVar3;
    }
    if ((mode != MRAA_GPIO_EDGE_NONE) && (dev->events == (mraa_gpio_events_t)0x0)) {
      __size = (ulong)dev->num_pins << 4;
      pmVar4 = (mraa_gpio_events_t)malloc(__size);
      dev->events = pmVar4;
      if (pmVar4 == (mraa_gpio_events_t)0x0) {
        syslog(3,"mraa_gpio_edge_mode() malloc error");
        return MRAA_ERROR_NO_RESOURCES;
      }
      for (sVar8 = 0; __size != sVar8; sVar8 = sVar8 + 0x10) {
        *(undefined4 *)((long)&pmVar4->id + sVar8) = 0xffffffff;
      }
    }
    if (plat->chardev_capable != 0) {
      mVar3 = mraa_gpio_chardev_edge_mode(dev,mode);
      return mVar3;
    }
    for (; dev != (mraa_gpio_context)0x0; dev = dev->next) {
      if (dev->value_fp != -1) {
        close(dev->value_fp);
        dev->value_fp = -1;
      }
      snprintf(filepath,0x40,"/sys/class/gpio/gpio%d/edge",(ulong)(uint)dev->pin);
      __fd = open(filepath,2);
      if (__fd == -1) {
        uVar1 = dev->pin;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        syslog(3,"gpio%i: edge_mode: Failed to open \'edge\' for writing: %s",(ulong)uVar1,pcVar7);
        return MRAA_ERROR_INVALID_RESOURCE;
      }
      switch(mode) {
      case MRAA_GPIO_EDGE_NONE:
        bu._0_8_ = (ulong)(uint3)bu._5_3_ << 0x28;
        builtin_strncpy(bu,"none",4);
        goto LAB_0010aa58;
      case MRAA_GPIO_EDGE_BOTH:
        bu._0_8_ = (ulong)(uint3)bu._5_3_ << 0x28;
        builtin_strncpy(bu,"both",4);
LAB_0010aa58:
        sStack_c0 = 4;
        break;
      case MRAA_GPIO_EDGE_RISING:
        builtin_strncpy(bu,"rising",7);
        uVar2 = bu._0_4_;
        bu._0_8_ = CONCAT44(bu._4_4_,uVar2);
        sStack_c0 = 6;
        break;
      case MRAA_GPIO_EDGE_FALLING:
        builtin_strncpy(bu,"falling",8);
        sStack_c0 = 7;
        break;
      default:
        mVar3 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        goto LAB_0010aaf6;
      }
      sVar5 = write(__fd,bu,sStack_c0);
      if (sVar5 == -1) {
        uVar1 = dev->pin;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        syslog(3,"gpio%i: edge_mode: Failed to write to \'edge\': %s",(ulong)uVar1,pcVar7);
        mVar3 = MRAA_ERROR_UNSPECIFIED;
LAB_0010aaf6:
        close(__fd);
        return mVar3;
      }
      close(__fd);
    }
    mVar3 = MRAA_SUCCESS;
  }
  return mVar3;
}

Assistant:

mraa_result_t
mraa_gpio_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_edge_mode_replace))
        return dev->advance_func->gpio_edge_mode_replace(dev, mode);

    /* Initialize events array. */
    if (dev->events == NULL && mode != MRAA_GPIO_EDGE_NONE) {
        dev->events = malloc(dev->num_pins * sizeof(mraa_gpio_event));
        if (dev->events == NULL) {
            syslog(LOG_ERR, "mraa_gpio_edge_mode() malloc error");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < dev->num_pins; ++i) {
            dev->events[i].id = -1;
        }
    }

    if (plat->chardev_capable)
        return mraa_gpio_chardev_edge_mode(dev, mode);

    mraa_gpio_context it = dev;

    while (it) {

        if (it->value_fp != -1) {
            close(it->value_fp);
            it->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/edge", it->pin);

        int edge = open(filepath, O_RDWR);
        if (edge == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to open 'edge' for writing: %s", it->pin,
                   strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_EDGE_NONE:
                length = snprintf(bu, sizeof(bu), "none");
                break;
            case MRAA_GPIO_EDGE_BOTH:
                length = snprintf(bu, sizeof(bu), "both");
                break;
            case MRAA_GPIO_EDGE_RISING:
                length = snprintf(bu, sizeof(bu), "rising");
                break;
            case MRAA_GPIO_EDGE_FALLING:
                length = snprintf(bu, sizeof(bu), "falling");
                break;
            default:
                close(edge);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(edge, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to write to 'edge': %s", it->pin, strerror(errno));
            close(edge);
            return MRAA_ERROR_UNSPECIFIED;
        }

        close(edge);

        it = it->next;
    }

    return MRAA_SUCCESS;
}